

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O0

void __thiscall
mjs::native_object::native_object(native_object *this,string *class_name,object_ptr *prototype)

{
  gc_heap *pgVar1;
  undefined1 local_30 [24];
  object_ptr *prototype_local;
  string *class_name_local;
  native_object *this_local;
  
  local_30._16_8_ = prototype;
  prototype_local = (object_ptr *)class_name;
  class_name_local = (string *)this;
  object::object(&this->super_object,class_name,prototype);
  (this->super_object)._vptr_object = (_func_int **)&PTR_get_00299650;
  pgVar1 = object::heap(&this->super_object);
  gc_vector<mjs::native_object::native_object_property>::make((gc_heap *)local_30,(uint32_t)pgVar1);
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>::
  gc_heap_ptr_untracked
            (&this->native_properties_,
             (gc_heap_ptr<mjs::gc_vector<mjs::native_object::native_object_property>_> *)local_30);
  gc_heap_ptr<mjs::gc_vector<mjs::native_object::native_object_property>_>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::gc_vector<mjs::native_object::native_object_property>_> *)local_30);
  return;
}

Assistant:

native_object::native_object(const string& class_name, const object_ptr& prototype)
    : object(class_name, prototype)
    , native_properties_(gc_vector<native_object_property>::make(heap(), 16)) {
}